

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolidDelegate.cpp
# Opt level: O0

void __thiscall MeshLib::SolidDelegate::removeEdge(SolidDelegate *this,Solid *pS,Edge *e)

{
  int iVar1;
  EdgeKey *pEVar2;
  tVertex this_00;
  tVertex this_01;
  HalfEdge **ppHVar3;
  Vertex *v2;
  Vertex *v1;
  Edge *e_local;
  Solid *pS_local;
  SolidDelegate *this_local;
  
  pEVar2 = Edge::ekey(e);
  iVar1 = EdgeKey::s(pEVar2);
  this_00 = Solid::idVertex(pS,iVar1);
  pEVar2 = Edge::ekey(e);
  iVar1 = EdgeKey::t(pEVar2);
  this_01 = Solid::idVertex(pS,iVar1);
  if (((this_00 != (tVertex)0x0) &&
      (ppHVar3 = Vertex::halfedge(this_00), *ppHVar3 == (HalfEdge *)0x0)) &&
     (removeVertex(this,pS,this_00), this_00 != (tVertex)0x0)) {
    Vertex::~Vertex(this_00);
    operator_delete(this_00);
  }
  if (((this_01 != (tVertex)0x0) &&
      (ppHVar3 = Vertex::halfedge(this_01), *ppHVar3 == (HalfEdge *)0x0)) &&
     (removeVertex(this,pS,this_01), this_01 != (tVertex)0x0)) {
    Vertex::~Vertex(this_01);
    operator_delete(this_01);
  }
  AVL::Tree<MeshLib::Edge>::remove(&pS->m_edges,(char *)e);
  return;
}

Assistant:

void SolidDelegate::removeEdge( Solid * pS, Edge * e)
{
	Vertex * v1 = pS->idVertex (e->ekey ().s ());
	Vertex * v2 = pS->idVertex (e->ekey ().t ());
	if(v1!= NULL && v1->halfedge () == NULL)
	{
		removeVertex(pS,v1);
		delete v1;
	}
	if(v2 != NULL && v2->halfedge () == NULL)
	{
		removeVertex(pS,v2);
		delete v2;
	}
	pS->m_edges.remove(e);
}